

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_widget_layout_states nk_widget(nk_rect *bounds,nk_context *ctx)

{
  undefined4 uVar1;
  nk_panel *pnVar2;
  undefined4 uVar3;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_rect v;
  nk_rect c;
  nk_context *ctx_local;
  nk_rect *bounds_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4f40,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4f41,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4f42,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
     (ctx->current->layout == (nk_panel *)0x0)) {
    bounds_local._4_4_ = NK_WIDGET_INVALID;
  }
  else {
    nk_panel_alloc_space(bounds,ctx);
    pnVar2 = ctx->current->layout;
    v.w = (pnVar2->clip).x;
    v.h = (pnVar2->clip).y;
    uVar1 = (pnVar2->clip).w;
    uVar3 = (pnVar2->clip).h;
    if ((pnVar2->flags & 0x8000) != 0) {
      __assert_fail("!(layout->flags & NK_WINDOW_MINIMIZED)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x4f52,
                    "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                   );
    }
    if ((pnVar2->flags & 0x2000) != 0) {
      __assert_fail("!(layout->flags & NK_WINDOW_HIDDEN)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x4f53,
                    "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                   );
    }
    if ((pnVar2->flags & 0x4000) != 0) {
      __assert_fail("!(layout->flags & NK_WINDOW_CLOSED)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x4f54,
                    "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                   );
    }
    bounds->x = (float)(int)bounds->x;
    bounds->y = (float)(int)bounds->y;
    bounds->w = (float)(int)bounds->w;
    bounds->h = (float)(int)bounds->h;
    v.w = (float)(int)v.w;
    v.h = (float)(int)v.h;
    nk_unify((nk_rect *)&win,(nk_rect *)&v.w,bounds->x,bounds->y,bounds->x + bounds->w,
             bounds->y + bounds->h);
    if (((v.w + (float)(int)(float)uVar1 < bounds->x) || (bounds->x + bounds->w < v.w)) ||
       ((v.h + (float)(int)(float)uVar3 < bounds->y || (bounds->y + bounds->h < v.h)))) {
      bounds_local._4_4_ = NK_WIDGET_INVALID;
    }
    else if ((((ctx->input).mouse.pos.x < win._0_4_) ||
             (win._0_4_ + v.x <= (ctx->input).mouse.pos.x)) ||
            (((ctx->input).mouse.pos.y < win._4_4_ || (win._4_4_ + v.y <= (ctx->input).mouse.pos.y))
            )) {
      bounds_local._4_4_ = NK_WIDGET_ROM;
    }
    else {
      bounds_local._4_4_ = NK_WIDGET_VALID;
    }
  }
  return bounds_local._4_4_;
}

Assistant:

NK_API enum nk_widget_layout_states
nk_widget(struct nk_rect *bounds, const struct nk_context *ctx)
{
    struct nk_rect c, v;
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return NK_WIDGET_INVALID;

    /* allocate space and check if the widget needs to be updated and drawn */
    nk_panel_alloc_space(bounds, ctx);
    win = ctx->current;
    layout = win->layout;
    in = &ctx->input;
    c = layout->clip;

    /*  if one of these triggers you forgot to add an `if` condition around either
        a window, group, popup, combobox or contextual menu `begin` and `end` block.
        Example:
            if (nk_begin(...) {...} nk_end(...); or
            if (nk_group_begin(...) { nk_group_end(...);} */
    NK_ASSERT(!(layout->flags & NK_WINDOW_MINIMIZED));
    NK_ASSERT(!(layout->flags & NK_WINDOW_HIDDEN));
    NK_ASSERT(!(layout->flags & NK_WINDOW_CLOSED));

    /* need to convert to int here to remove floating point errors */
    bounds->x = (float)((int)bounds->x);
    bounds->y = (float)((int)bounds->y);
    bounds->w = (float)((int)bounds->w);
    bounds->h = (float)((int)bounds->h);

    c.x = (float)((int)c.x);
    c.y = (float)((int)c.y);
    c.w = (float)((int)c.w);
    c.h = (float)((int)c.h);

    nk_unify(&v, &c, bounds->x, bounds->y, bounds->x + bounds->w, bounds->y + bounds->h);
    if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds->x, bounds->y, bounds->w, bounds->h))
        return NK_WIDGET_INVALID;
    if (!NK_INBOX(in->mouse.pos.x, in->mouse.pos.y, v.x, v.y, v.w, v.h))
        return NK_WIDGET_ROM;
    return NK_WIDGET_VALID;
}